

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_ignoreOtherStillFailsIfExpectedOneDidntHappen_Test::
~TEST_MockCallTest_ignoreOtherStillFailsIfExpectedOneDidntHappen_Test
          (TEST_MockCallTest_ignoreOtherStillFailsIfExpectedOneDidntHappen_Test *this)

{
  TEST_MockCallTest_ignoreOtherStillFailsIfExpectedOneDidntHappen_Test *this_local;
  
  ~TEST_MockCallTest_ignoreOtherStillFailsIfExpectedOneDidntHappen_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherStillFailsIfExpectedOneDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foo");
    mock().ignoreOtherCalls();
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}